

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternprops.cpp
# Opt level: O1

UBool icu_63::PatternProps::isSyntaxOrWhiteSpace(UChar32 c)

{
  bool bVar1;
  
  if (-1 < c) {
    if (c < 0x100) {
      return latin1[(uint)c] & 1;
    }
    if (0x200d < c) {
      if (c < 0x3031) {
        bVar1 = (*(uint *)(syntaxOrWhiteSpace2000 + (ulong)(byte)index2000[c - 0x2000U >> 5] * 4) >>
                 (c & 0x1fU) & 1) != 0;
      }
      else {
        if (0x108 < c - 0xfd3eU) {
          return '\0';
        }
        bVar1 = c - 0xfe45U < 0xfffffefb;
      }
      return bVar1;
    }
  }
  return '\0';
}

Assistant:

UBool
PatternProps::isSyntaxOrWhiteSpace(UChar32 c) {
    if(c<0) {
        return FALSE;
    } else if(c<=0xff) {
        return (UBool)(latin1[c]&1);
    } else if(c<0x200e) {
        return FALSE;
    } else if(c<=0x3030) {
        uint32_t bits=syntaxOrWhiteSpace2000[index2000[(c-0x2000)>>5]];
        return (UBool)((bits>>(c&0x1f))&1);
    } else if(0xfd3e<=c && c<=0xfe46) {
        return c<=0xfd3f || 0xfe45<=c;
    } else {
        return FALSE;
    }
}